

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::scanDocumentIndicator(Scanner *this,bool IsStart)

{
  undefined7 in_register_00000031;
  Token local_50;
  
  unrollIndent(this,-1);
  (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
  super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
  super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.super_SmallVectorBase.Size
       = 0;
  this->IsSimpleKeyAllowed = false;
  local_50.Value._M_dataplus._M_p = (pointer)&local_50.Value.field_2;
  local_50.Value._M_string_length = 0;
  local_50.Value.field_2._M_local_buf[0] = '\0';
  local_50.Kind = TK_DocumentEnd - (int)CONCAT71(in_register_00000031,IsStart);
  local_50.Range.Data = this->Current;
  local_50.Range.Length = 3;
  skip(this,3);
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,&local_50);
  std::__cxx11::string::_M_dispose();
  return true;
}

Assistant:

bool Scanner::scanDocumentIndicator(bool IsStart) {
  unrollIndent(-1);
  SimpleKeys.clear();
  IsSimpleKeyAllowed = false;

  Token T;
  T.Kind = IsStart ? Token::TK_DocumentStart : Token::TK_DocumentEnd;
  T.Range = StringRef(Current, 3);
  skip(3);
  TokenQueue.push_back(T);
  return true;
}